

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FreeConstraintPS::FreeConstraintPS
          (FreeConstraintPS *this,SPxLPBase<double> *lp,int _i,shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  int *piVar2;
  DSVectorBase<double> *this_00;
  PostStep *in_RCX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  double dVar3;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff88;
  SVectorBase<double> *old;
  SPxLPBase<double> *in_stack_ffffffffffffff90;
  SPxLPBase<double> *this_01;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 local_14;
  
  local_14 = in_EDX;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x27f742);
  iVar1 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x27f752);
  this_01 = (SPxLPBase<double> *)&stack0xffffffffffffffd0;
  PostStep::PostStep(in_RCX,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                     in_stack_ffffffffffffffa0,(int)((ulong)this_01 >> 0x20),(int)this_01);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x27f786);
  *in_RDI = &PTR__FreeConstraintPS_008973f0;
  *(undefined4 *)(in_RDI + 5) = local_14;
  piVar2 = (int *)((long)in_RDI + 0x2c);
  iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x27f7af);
  *piVar2 = iVar1 + -1;
  old = (SVectorBase<double> *)(in_RDI + 6);
  this_00 = (DSVectorBase<double> *)
            SPxLPBase<double>::rowVector(in_stack_ffffffffffffff90,(int)((ulong)old >> 0x20));
  DSVectorBase<double>::DSVectorBase<double>(this_00,old);
  dVar3 = SPxLPBase<double>::rowObj(this_01,(int)((ulong)this_00 >> 0x20));
  in_RDI[10] = dVar3;
  return;
}

Assistant:

FreeConstraintPS(const SPxLPBase<R>& lp, int _i, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeConstraint", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_row(lp.rowVector(_i))
         , m_row_obj(lp.rowObj(_i))
      {}